

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall
ON_BinaryArchive::ArchiveContains3dmTable(ON_BinaryArchive *this,ON_3dmArchiveTableType table)

{
  bool bVar1;
  uint uVar2;
  uint opennurbs_library_version;
  
  if (this->m_mode == write3dm) {
    uVar2 = ON::Version();
  }
  else {
    uVar2 = 0;
    if (this->m_mode == read3dm) {
      uVar2 = this->m_3dm_opennurbs_version;
    }
  }
  opennurbs_library_version = 0xbebf1b2;
  if (3 < this->m_3dm_version) {
    opennurbs_library_version = 0;
  }
  if (uVar2 != 0) {
    opennurbs_library_version = uVar2;
  }
  bVar1 = ArchiveContains3dmTable(table,this->m_3dm_version,opennurbs_library_version);
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::ArchiveContains3dmTable(
  ON_3dmArchiveTableType table
  ) const
{
  unsigned int opennurbs_library_version = 0;
  if (ON::archive_mode::read3dm == Mode())
    opennurbs_library_version = m_3dm_opennurbs_version;
  else if (ON::archive_mode::write3dm == Mode())
    opennurbs_library_version = ON::Version();

  if ( 0 == opennurbs_library_version && m_3dm_version <= 3)
    opennurbs_library_version = 200012210;
  
  return ON_BinaryArchive::ArchiveContains3dmTable(
    table,
    m_3dm_version,
    opennurbs_library_version
    );
}